

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O1

monster_conflict * choose_nearby_injured_kin(chunk *c,monster_conflict *mon)

{
  bool bVar1;
  wchar_t wVar2;
  uint32_t uVar3;
  monster_conflict *pmVar4;
  loc grid;
  uint32_t m;
  wchar_t wVar5;
  monster_conflict *pmVar6;
  
  pmVar6 = (monster_conflict *)0x0;
  m = 0;
  wVar2 = (mon->grid).y + L'\xfffffffb';
  do {
    wVar5 = (mon->grid).x + L'\xfffffffa';
    do {
      wVar5 = wVar5 + L'\x01';
      grid.y = wVar2;
      grid.x = wVar5;
      pmVar4 = get_injured_kin(c,mon,grid);
      if (pmVar4 != (monster_conflict *)0x0) {
        m = m + 1;
        uVar3 = Rand_div(m);
        if (uVar3 == 0) {
          pmVar6 = pmVar4;
        }
      }
    } while (wVar5 < (mon->grid).x + L'\x05');
    bVar1 = wVar2 < (mon->grid).y + L'\x05';
    wVar2 = wVar2 + L'\x01';
  } while (bVar1);
  return pmVar6;
}

Assistant:

struct monster *choose_nearby_injured_kin(struct chunk *c,
                                          const struct monster *mon)
{
	struct loc grid;
	int nseen = 0;
	struct monster *found = NULL;

	for (grid.y = mon->grid.y - MAX_KIN_RADIUS;
		 grid.y <= mon->grid.y + MAX_KIN_RADIUS; grid.y++) {
		for (grid.x = mon->grid.x - MAX_KIN_RADIUS;
			 grid.x <= mon->grid.x + MAX_KIN_RADIUS; grid.x++) {
			struct monster *kin = get_injured_kin(c, mon, grid);
			if (kin) {
				nseen++;
				if (!randint0(nseen))
					found = kin;
			}
		}
	}

	return found;
}